

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O2

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int _c;
  float fVar8;
  Mat local_70;
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  fVar1 = this->lambda;
  fVar2 = this->alpha;
  uVar5 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  uVar4 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar4 = uVar5;
  }
  while (_c = (int)uVar5, _c != (int)uVar4) {
    Mat::channel(&local_70,bottom_top_blob,_c);
    pvVar3 = local_70.data;
    Mat::~Mat(&local_70);
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      fVar8 = *(float *)((long)pvVar3 + uVar5 * 4);
      if (0.0 <= fVar8) {
        fVar8 = fVar8 * this->lambda;
      }
      else {
        fVar8 = expf(fVar8);
        fVar8 = (fVar8 + -1.0) * fVar1 * fVar2;
      }
      *(float *)((long)pvVar3 + uVar5 * 4) = fVar8;
    }
    uVar5 = (ulong)(_c + 1);
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (exp(ptr[i]) - 1.f) * alphaxlambda;
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}